

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_inter_segment_id
               (AV1_COMP *cpi,MACROBLOCKD *xd,aom_writer *w,segmentation *seg,
               segmentation_probs *segp,int skip,int preskip)

{
  int mi_row;
  int mi_col;
  MB_MODE_INFO *mbmi;
  ulong uVar1;
  ulong uVar2;
  uint symb;
  
  if (seg->update_map == '\0') {
    return;
  }
  mbmi = *xd->mi;
  mi_row = xd->mi_row;
  mi_col = xd->mi_col;
  if (preskip == 0) {
    if (seg->segid_preskip != '\0') {
      return;
    }
    if (skip != 0) {
      write_segment_id(cpi,xd,mbmi,w,seg,segp,1);
      if (seg->temporal_update == '\0') {
        return;
      }
      mbmi->field_0xa7 = mbmi->field_0xa7 & 0xf7;
      return;
    }
  }
  else if (seg->segid_preskip == '\0') {
    return;
  }
  if (seg->temporal_update != '\0') {
    symb = *(ushort *)&mbmi->field_0xa7 >> 3 & 1;
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)(*(ushort *)&xd->above_mbmi->field_0xa7 >> 3 & 1);
    }
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(*(ushort *)&xd->left_mbmi->field_0xa7 >> 3 & 1);
    }
    aom_write_symbol(w,symb,segp->pred_cdf[uVar2 + uVar1],2);
    if ((short)symb != 0) {
      set_spatial_segment_id
                (&(cpi->common).mi_params,((cpi->common).cur_frame)->seg_map,mbmi->bsize,mi_row,
                 mi_col,(byte)*(undefined2 *)&mbmi->field_0xa7 & 7);
      return;
    }
  }
  write_segment_id(cpi,xd,mbmi,w,seg,segp,0);
  return;
}

Assistant:

static inline void write_inter_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                          aom_writer *w,
                                          const struct segmentation *const seg,
                                          struct segmentation_probs *const segp,
                                          int skip, int preskip) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  AV1_COMMON *const cm = &cpi->common;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (seg->update_map) {
    if (preskip) {
      if (!seg->segid_preskip) return;
    } else {
      if (seg->segid_preskip) return;
      if (skip) {
        write_segment_id(cpi, xd, mbmi, w, seg, segp, 1);
        if (seg->temporal_update) mbmi->seg_id_predicted = 0;
        return;
      }
    }
    if (seg->temporal_update) {
      const int pred_flag = mbmi->seg_id_predicted;
      aom_cdf_prob *pred_cdf = av1_get_pred_cdf_seg_id(segp, xd);
      aom_write_symbol(w, pred_flag, pred_cdf, 2);
      if (!pred_flag) {
        write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);
      }
      if (pred_flag) {
        set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map,
                               mbmi->bsize, mi_row, mi_col, mbmi->segment_id);
      }
    } else {
      write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);
    }
  }
}